

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_interface.cc
# Opt level: O3

double lf::geometry::Volume(Geometry *geo)

{
  double *pdVar1;
  double **ppdVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  double dVar4;
  double *pdVar5;
  uint uVar6;
  int iVar7;
  Scalar *pSVar8;
  runtime_error *this;
  long lVar9;
  Index index;
  ulong uVar10;
  long lVar11;
  Matrix<double,__1,_1,_0,__1,_1> refc;
  stringstream ss;
  double local_240;
  string local_238;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_218;
  string local_208;
  string local_1e8;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1c8;
  undefined1 local_1a8 [16];
  long local_198;
  
  uVar6 = (**geo->_vptr_Geometry)();
  local_218.m_storage.m_data = (double *)0x0;
  local_218.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_218,(ulong)uVar6,1)
  ;
  uVar6 = (*geo->_vptr_Geometry[2])(geo);
  switch(uVar6 & 0xff) {
  case 1:
    local_240 = 1.0;
    goto LAB_002f424f;
  case 2:
    local_1a8._0_8_ = &DAT_3fe0000000000000;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
              (&local_1c8,(Matrix<double,__1,_1,_0,__1,_1> *)&local_218,(Scalar *)local_1a8);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished(&local_1c8);
    break;
  case 3:
    local_238._M_dataplus._M_p = &DAT_3fd5555555555555;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1a8,
               (Matrix<double,__1,_1,_0,__1,_1> *)&local_218,(Scalar *)&local_238);
    local_208._M_dataplus._M_p = &DAT_3fd5555555555555;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1a8,
               (Scalar *)&local_208);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1a8);
    uVar6 = 0x3fe00000;
    goto LAB_002f4168;
  case 4:
    local_238._M_dataplus._M_p = &DAT_3fe0000000000000;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1a8,
               (Matrix<double,__1,_1,_0,__1,_1> *)&local_218,(Scalar *)&local_238);
    local_208._M_dataplus._M_p = &DAT_3fe0000000000000;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1a8,
               (Scalar *)&local_208);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1a8);
    break;
  default:
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,"Volume not available for ",0x19);
    iVar7 = (*geo->_vptr_Geometry[2])(geo);
    local_208._M_dataplus._M_p._0_1_ = (char)iVar7;
    base::RefEl::ToString_abi_cxx11_(&local_238,(RefEl *)&local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,local_238._M_dataplus._M_p,local_238._M_string_length);
    paVar3 = &local_238.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar3) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    local_238._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"false","");
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/geometry_interface.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_238,&local_208,0x23,&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar3) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"this code should not be reached");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar6 = 0x3ff00000;
LAB_002f4168:
  local_1a8._0_8_ = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
  local_1a8._8_8_ = 0;
  local_198 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1a8,
             local_218.m_storage.m_rows,1);
  pdVar5 = local_218.m_storage.m_data;
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,double,double>
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_1a8,
             (Matrix<double,__1,_1,_0,__1,_1> *)&local_218,(assign_op<double,_double> *)&local_208);
  lVar9 = local_198 * local_1a8._8_8_;
  uVar10 = lVar9 - (lVar9 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < lVar9) {
    lVar11 = 0;
    do {
      pdVar1 = pdVar5 + lVar11;
      dVar4 = pdVar1[1];
      ppdVar2 = &(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1a8._0_8_)->
                 m_storage).m_data + lVar11;
      *ppdVar2 = (double *)*pdVar1;
      ppdVar2[1] = (double *)dVar4;
      lVar11 = lVar11 + 2;
    } while (lVar11 < (long)uVar10);
  }
  if ((long)uVar10 < lVar9) {
    do {
      (&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1a8._0_8_)->m_storage).
        m_data)[uVar10] = (double *)pdVar5[uVar10];
      uVar10 = uVar10 + 1;
    } while (lVar9 - uVar10 != 0);
  }
  (*geo->_vptr_Geometry[6])(&local_238,geo,local_1a8);
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&local_238,0);
  local_240 = (double)((ulong)uVar6 << 0x20) * *pSVar8;
  free(local_238._M_dataplus._M_p);
  free((void *)local_1a8._0_8_);
LAB_002f424f:
  free(local_218.m_storage.m_data);
  return local_240;
}

Assistant:

double Volume(const Geometry& geo) {
  const lf::base::dim_t refdim = geo.DimLocal();

  Eigen::Matrix<double, Eigen::Dynamic, 1> refc(refdim, 1);
  double refvol = 1.0;
  switch (geo.RefEl()) {
    case lf::base::RefEl::kPoint(): {
      return 1.0;
    }
    case lf::base::RefEl::kSegment(): {
      refc << 0.5;
      break;
    }
    case lf::base::RefEl::kTria(): {
      refvol = 0.5;
      refc << 1.0 / 3, 1.0 / 3;
      break;
    }
    case lf::base::RefEl::kQuad(): {
      refc << 0.5, 0.5;
      break;
    }
    default: {
      LF_VERIFY_MSG(false,
                    "Volume not available for " << geo.RefEl().ToString());
    }
  }  // end switch RefEl
  return (refvol * ((geo.IntegrationElement(refc))[0]));
}